

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::setFillRule(QPainterPath *this,FillRule fillRule)

{
  QPainterPathPrivate *pQVar1;
  int in_ESI;
  byte bVar2;
  bool isWindingRequested;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  ensureData((QPainterPath *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  bVar2 = in_ESI == 1;
  pQVar1 = d_func((QPainterPath *)0x5b8c88);
  if (((byte)pQVar1->field_0x84 >> 5 & 1) != bVar2) {
    detach((QPainterPath *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    pQVar1 = d_func((QPainterPath *)0x5b8cc4);
    pQVar1->field_0x84 = pQVar1->field_0x84 & 0xdf | (bVar2 & 1) << 5;
  }
  return;
}

Assistant:

void QPainterPath::setFillRule(Qt::FillRule fillRule)
{
    ensureData();
    const bool isWindingRequested = (fillRule == Qt::WindingFill);
    if (d_func()->hasWindingFill == isWindingRequested)
        return;
    detach();

    d_func()->hasWindingFill = isWindingRequested;
}